

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTriang>_>::CopyIntPtIndicesFrom
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTriang>_> *this,
          TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTriang>_> *copy)

{
  long *plVar1;
  long *plVar2;
  TPZMaterial *pTVar3;
  ostream *poVar4;
  long lVar5;
  int64_t newsize;
  
  pTVar3 = TPZCompEl::Material((TPZCompEl *)this);
  if (pTVar3 != (TPZMaterial *)0x0) {
    newsize = (copy->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements;
    TPZManVector<long,_128>::Resize(&(this->fIntPtIndices).super_TPZManVector<long,_128>,newsize);
    plVar1 = (copy->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
    plVar2 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
    lVar5 = 0;
    if (newsize < 1) {
      newsize = lVar5;
    }
    for (; newsize != lVar5; lVar5 = lVar5 + 1) {
      plVar2[lVar5] = plVar1[lVar5];
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Error at ");
  poVar4 = std::operator<<(poVar4,
                           "void TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTriang>>::CopyIntPtIndicesFrom(const TPZCompElWithMem<TBASE> &) [TBASE = TPZCompElH1<pzshape::TPZShapeTriang>]"
                          );
  std::operator<<(poVar4," this->Material() == NULL\n");
  return;
}

Assistant:

void TPZCompElWithMem<TBASE>::CopyIntPtIndicesFrom(const TPZCompElWithMem<TBASE> & copy)
{
    
    TPZMaterial * material = TBASE::Material();
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
    
    int64_t i, n = copy.fIntPtIndices.NElements();
    fIntPtIndices.Resize(n);
    
    for(i = 0; i < n; i++)
    {
        fIntPtIndices[i] = copy.fIntPtIndices[i];
    }
}